

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void init_race_probs(void)

{
  uint uVar1;
  long lVar2;
  int *piVar3;
  void *p;
  void *p_00;
  void *p_01;
  void *pvVar4;
  level_conflict *plVar5;
  level_conflict *plVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  player_race **pppVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  level_map_conflict *map;
  long lVar14;
  ulong uVar15;
  level_conflict *local_40;
  level_conflict *local_38;
  
  race_prob = (int **)mem_zalloc((ulong)z_info->p_race_max << 3);
  for (uVar15 = 0; uVar15 < z_info->p_race_max; uVar15 = uVar15 + 1) {
    piVar3 = (int *)mem_zalloc((long)world->num_levels << 2);
    race_prob[uVar15] = piVar3;
  }
  p = mem_zalloc((long)world->num_levels << 3);
  p_00 = mem_zalloc((long)world->num_levels << 3);
  p_01 = mem_zalloc((long)world->num_levels << 3);
  lVar14 = 0;
  while( true ) {
    uVar1 = world->num_levels;
    if ((int)uVar1 <= lVar14) break;
    pvVar4 = mem_zalloc((long)(int)uVar1 << 2);
    *(void **)((long)p + lVar14 * 8) = pvVar4;
    pvVar4 = mem_zalloc((long)world->num_levels << 2);
    *(void **)((long)p_00 + lVar14 * 8) = pvVar4;
    pvVar4 = mem_zalloc((long)world->num_levels << 2);
    *(void **)((long)p_01 + lVar14 * 8) = pvVar4;
    lVar14 = lVar14 + 1;
  }
  map = world;
  for (lVar14 = 0; uVar15 = (ulong)uVar1, lVar14 < (int)uVar1; lVar14 = lVar14 + 1) {
    plVar6 = map->levels;
    if (plVar6[lVar14].north == (char *)0x0) {
      local_38 = (level_conflict *)0x0;
    }
    else {
      local_38 = level_by_name(map,plVar6[lVar14].north);
      map = world;
    }
    if (plVar6[lVar14].east == (char *)0x0) {
      local_40 = (level_conflict *)0x0;
    }
    else {
      local_40 = level_by_name(map,plVar6[lVar14].east);
      map = world;
    }
    if (plVar6[lVar14].south == (char *)0x0) {
      plVar5 = (level_conflict *)0x0;
    }
    else {
      plVar5 = level_by_name(map,plVar6[lVar14].south);
      map = world;
    }
    if (plVar6[lVar14].west == (char *)0x0) {
      plVar6 = (level_conflict *)0x0;
    }
    else {
      plVar6 = level_by_name(map,plVar6[lVar14].west);
      map = world;
    }
    for (lVar9 = 0; lVar9 < map->num_levels; lVar9 = lVar9 + 1) {
      *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + lVar9 * 4) = 0;
      *(undefined4 *)(*(long *)((long)p_00 + lVar14 * 8) + lVar9 * 4) = 0;
      *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + lVar9 * 4) = 0;
    }
    if (local_38 != (level_conflict *)0x0) {
      *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)local_38->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)local_38->index * 4) = 1;
    }
    if (local_40 != (level_conflict *)0x0) {
      *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)local_40->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)local_40->index * 4) = 1;
    }
    if (plVar5 != (level_conflict *)0x0) {
      *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)plVar5->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)plVar5->index * 4) = 1;
    }
    if (plVar6 != (level_conflict *)0x0) {
      *(undefined4 *)(*(long *)((long)p + lVar14 * 8) + (long)plVar6->index * 4) = 1;
      *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + (long)plVar6->index * 4) = 1;
    }
    uVar1 = map->num_levels;
  }
  for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
    for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
      for (lVar9 = 0; lVar9 < (int)uVar15; lVar9 = lVar9 + 1) {
        lVar2 = *(long *)((long)p_00 + lVar14 * 8);
        *(undefined4 *)(lVar2 + lVar9 * 4) = 0;
        iVar11 = 0;
        for (lVar12 = 0; uVar15 = (ulong)map->num_levels, lVar12 < (long)uVar15; lVar12 = lVar12 + 1
            ) {
          iVar11 = iVar11 + *(int *)(*(long *)((long)p_01 + lVar12 * 8) + lVar9 * 4) *
                            *(int *)(*(long *)((long)p_01 + lVar14 * 8) + lVar12 * 4);
          *(int *)(lVar2 + lVar9 * 4) = iVar11;
        }
      }
    }
    for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
      for (lVar9 = 0; lVar9 < (int)uVar15; lVar9 = lVar9 + 1) {
        *(undefined4 *)(*(long *)((long)p_01 + lVar14 * 8) + lVar9 * 4) =
             *(undefined4 *)(*(long *)((long)p_00 + lVar14 * 8) + lVar9 * 4);
        uVar15 = (ulong)(uint)map->num_levels;
      }
    }
  }
  for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
    for (lVar9 = 0; lVar9 < (int)uVar15; lVar9 = lVar9 + 1) {
      lVar2 = *(long *)((long)p_00 + lVar14 * 8);
      *(undefined4 *)(lVar2 + lVar9 * 4) = 0;
      lVar12 = *(long *)((long)p_01 + lVar14 * 8);
      iVar8 = 0;
      lVar13 = 0;
      while( true ) {
        uVar15 = (ulong)map->num_levels;
        if ((long)uVar15 <= lVar13) break;
        iVar8 = iVar8 + *(int *)(*(long *)((long)p + lVar13 * 8) + lVar9 * 4) *
                        *(int *)(lVar12 + lVar13 * 4);
        *(int *)(lVar2 + lVar9 * 4) = iVar8;
        lVar13 = lVar13 + 1;
      }
      iVar11 = *(int *)(lVar12 + lVar9 * 4);
      if (iVar8 < iVar11) {
        *(int *)(lVar2 + lVar9 * 4) = iVar11;
        uVar15 = (ulong)(uint)map->num_levels;
      }
    }
  }
  for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
    iVar8 = 0;
    pppVar10 = &races;
    while (pppVar10 = &((player_race *)pppVar10)->next->next,
          (player_race *)pppVar10 != (player_race *)0x0) {
      pcVar7 = strstr(map->name,"Dungeon");
      lVar9 = 1;
      if (pcVar7 == (char *)0x0) {
        plVar6 = level_by_name(map,((player_race *)pppVar10)->hometown);
        lVar9 = (long)plVar6->index;
        map = world;
      }
      iVar8 = iVar8 + 1 +
              *(int *)(*(long *)((long)p_00 + (long)map->levels[lVar9].index * 8) + lVar14 * 4);
      race_prob[((player_race *)pppVar10)->ridx][lVar14] = iVar8;
    }
    uVar15 = (ulong)(uint)map->num_levels;
  }
  for (lVar14 = 0; lVar14 < (int)uVar15; lVar14 = lVar14 + 1) {
    mem_free(*(void **)((long)p_01 + lVar14 * 8));
    mem_free(*(void **)((long)p + lVar14 * 8));
    mem_free(*(void **)((long)p_00 + lVar14 * 8));
    uVar15 = (ulong)(uint)world->num_levels;
  }
  mem_free(p_01);
  mem_free(p);
  mem_free(p_00);
  return;
}

Assistant:

void init_race_probs(void)
{
	int i, j, k, n;
	int **adjacency, **lev_path, **temp_path;

	/* Make the array */
	race_prob = mem_zalloc(z_info->p_race_max * sizeof(int*));
	for (i = 0; i < z_info->p_race_max; i++) {
		race_prob[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Prepare temporary adjacency arrays */
	adjacency = mem_zalloc(world->num_levels * sizeof(int*));
	lev_path = mem_zalloc(world->num_levels * sizeof(int*));
	temp_path = mem_zalloc(world->num_levels * sizeof(int*));
	for (i = 0; i < world->num_levels; i++) {
		adjacency[i] = mem_zalloc(world->num_levels * sizeof(int));
		lev_path[i] = mem_zalloc(world->num_levels * sizeof(int));
		temp_path[i] = mem_zalloc(world->num_levels * sizeof(int));
	}

	/* Make the adjacency matrix */
	for (i = 0; i < world->num_levels; i++) {
		/* Get the horizontally adjacent levels */
		struct level *lev = &world->levels[i];
		struct level *north = NULL;
		struct level *east = NULL;
		struct level *south = NULL;
		struct level *west = NULL;
		if (lev->north) north = level_by_name(world, lev->north);
		if (lev->east) east = level_by_name(world, lev->east);
		if (lev->south) south = level_by_name(world, lev->south);
		if (lev->west) west = level_by_name(world, lev->west);

		/* Initialise this row */
		for (k = 0; k < world->num_levels; k++) {
			adjacency[i][k] = 0;
			lev_path[i][k] = 0;
			temp_path[i][k] = 0;
		}

		/* Add 1s where there's an adjacent stage (not up or down) */
		if (north) {
			adjacency[i][north->index] = 1;
			temp_path[i][north->index] = 1;
		}
		if (east) {
			adjacency[i][east->index] = 1;
			temp_path[i][east->index] = 1;
		}
		if (south) {
			adjacency[i][south->index] = 1;
			temp_path[i][south->index] = 1;
		}
		if (west) {
			adjacency[i][west->index] = 1;
			temp_path[i][west->index] = 1;
		}
	}

	/* Power it up (squaring 3 times gives eighth power) */
	for (n = 0; n < 3; n++) {
		/* Square */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				lev_path[i][j] = 0;
				for (k = 0; k < world->num_levels; k++) {
					lev_path[i][j] += temp_path[i][k] * temp_path[k][j];
				}
			}
		}

		/* Copy it over for the next squaring or final multiply */
		for (i = 0; i < world->num_levels; i++) {
			for (j = 0; j < world->num_levels; j++) {
				temp_path[i][j] = lev_path[i][j];
			}
		}
	}

	/* Get the max of length 8 and length 9 paths */
	for (i = 0; i < world->num_levels; i++) {
		for (j = 0; j < world->num_levels; j++) {
			/* Multiply to get the length 9s */
			lev_path[i][j] = 0;
			for (k = 0; k < world->num_levels; k++) {
				lev_path[i][j] += temp_path[i][k] * adjacency[k][j];
			}

			/* Now replace by the length 8s if it's larger */
			if (lev_path[i][j] < temp_path[i][j]) {
				lev_path[i][j] = temp_path[i][j];
			}
		}
	}

	/* We now have the maximum of the number of paths of length 8 and the
	 * number of paths of length 9 (we need to try odd and even length paths,
	 * as using just one leads to anomalies) from any level to any other,
	 * which we will use as a basis for the racial probability table for
	 * racially based monsters in any given level.  For a level, we give
	 * every race a 1, then add the number of paths of length 8 from their
	 * hometown to that level.  We then turn every row entry into the
	 * cumulative total of the row to that point.  Whenever a racially based
	 * monster is called for, we will take a random integer less than the
	 * last entry of the row for that level, and proceed along the row,
	 * allocating the race corresponding to the position where we first
	 * exceed that integer.
	 */
	for (i = 0; i < world->num_levels; i++) {
		int prob = 0;
		struct player_race *p_race = races;
		while (p_race) {
			int hometown = 	strstr(world->name, "Dungeon") ? 1 :
				level_by_name(world, p_race->hometown)->index;
			/* Enter the cumulative probability */
			prob += 1 + lev_path[world->levels[hometown].index][i];
			race_prob[p_race->ridx][i] = prob;
			p_race = p_race->next;
		}
	}

	/* Free the temporary arrays */
	for (i = 0; i < world->num_levels; i++) {
		mem_free(temp_path[i]);
		mem_free(adjacency[i]);
		mem_free(lev_path[i]);
	}
	mem_free(temp_path);
	mem_free(adjacency);
	mem_free(lev_path);
}